

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunningTest::ranToCompletion(RunningTest *this)

{
  this->m_runStatus = RanToCompletionWithSections;
  if (this->m_lastSectionToRun != (RunningSection *)0x0) {
    RunningSection::ranToCompletion(this->m_lastSectionToRun);
    this->m_changed = true;
  }
  return;
}

Assistant:

void ranToCompletion() {
            if( m_runStatus != RanAtLeastOneSection && m_runStatus != EncounteredASection )
                m_runStatus = RanToCompletionWithNoSections;
            m_runStatus = RanToCompletionWithSections;
            if( m_lastSectionToRun ) {
                m_lastSectionToRun->ranToCompletion();
                m_changed = true;
            }
        }